

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

bool __thiscall
cmLocalGenerator::GetRealDependency
          (cmLocalGenerator *this,string *inName,string *config,string *dep)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  TargetType TVar6;
  cmGeneratorTarget *this_00;
  cmSourceFile *this_01;
  string *psVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string tLocation;
  string depLocation;
  string name;
  undefined1 local_d0 [32];
  size_type local_b0;
  pointer local_a8;
  string local_a0;
  string local_80;
  string local_50;
  
  cmsys::SystemTools::GetFilenameName(&local_50,inName);
  if (local_50._M_string_length == 0) {
LAB_0020a7fc:
    bVar4 = false;
    goto LAB_0020a9d3;
  }
  cmsys::SystemTools::GetFilenameLastExtension((string *)local_d0,&local_50);
  iVar5 = std::__cxx11::string::compare(local_d0);
  pcVar2 = local_d0 + 0x10;
  if ((pointer)local_d0._0_8_ != pcVar2) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if (iVar5 == 0) {
    cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)local_d0,&local_50);
    std::__cxx11::string::operator=((string *)&local_50,(string *)local_d0);
    if ((pointer)local_d0._0_8_ != pcVar2) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
  }
  this_00 = FindGeneratorTargetToUse(this,&local_50);
  if (this_00 == (cmGeneratorTarget *)0x0) {
LAB_0020a803:
    bVar4 = cmsys::SystemTools::FileIsFullPath(inName);
    if (bVar4) {
      bVar4 = true;
      std::__cxx11::string::_M_assign((string *)dep);
      goto LAB_0020a9d3;
    }
    this_01 = cmMakefile::GetSource(this->Makefile,inName,Ambiguous);
    if (this_01 != (cmSourceFile *)0x0) {
      cmSourceFile::ResolveFullPath(this_01,(string *)0x0,(string *)0x0);
      bVar4 = true;
      std::__cxx11::string::_M_assign((string *)dep);
      goto LAB_0020a9d3;
    }
    cmStateSnapshot::GetDirectory
              ((cmStateDirectory *)local_d0,&(this->super_cmOutputConverter).StateSnapshot);
    psVar7 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_d0);
    local_d0._8_8_ = (psVar7->_M_dataplus)._M_p;
    local_d0._0_8_ = psVar7->_M_string_length;
    paVar1 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)0x1;
    local_80.field_2._M_local_buf[0] = '/';
    local_d0._16_8_ = 1;
    local_a8 = (inName->_M_dataplus)._M_p;
    local_b0 = inName->_M_string_length;
    views._M_len = 3;
    views._M_array = (iterator)local_d0;
    local_d0._24_8_ = paVar1;
    local_80._M_string_length = (size_type)paVar1;
    cmCatViews_abi_cxx11_(&local_a0,views);
    std::__cxx11::string::operator=((string *)dep,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    bVar4 = cmsys::SystemTools::FileExists(dep);
    if (!bVar4) {
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)local_d0,&(this->super_cmOutputConverter).StateSnapshot);
      psVar7 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_d0);
      local_d0._8_8_ = (psVar7->_M_dataplus)._M_p;
      local_d0._0_8_ = psVar7->_M_string_length;
      local_80._M_dataplus._M_p = (pointer)0x1;
      local_80.field_2._M_local_buf[0] = '/';
      local_d0._16_8_ = 1;
      local_a8 = (inName->_M_dataplus)._M_p;
      local_b0 = inName->_M_string_length;
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_d0;
      local_d0._24_8_ = paVar1;
      local_80._M_string_length = (size_type)paVar1;
      cmCatViews_abi_cxx11_(&local_a0,views_00);
      std::__cxx11::string::operator=((string *)dep,(string *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    }
    psVar7 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
    cmsys::SystemTools::CollapseFullPath((string *)local_d0,dep,psVar7);
LAB_0020a9b3:
    std::__cxx11::string::operator=((string *)dep,(string *)local_d0);
  }
  else {
    bVar4 = cmsys::SystemTools::FileIsFullPath(inName);
    if (!bVar4) {
LAB_0020a7bf:
      TVar6 = cmGeneratorTarget::GetType(this_00);
      if (UNKNOWN_LIBRARY < TVar6) goto LAB_0020a803;
      if ((0x10fU >> (TVar6 & 0x1f) & 1) == 0) goto LAB_0020a7fc;
      cmGeneratorTarget::GetFullPath((string *)local_d0,this_00,config,RuntimeBinaryArtifact,true);
      goto LAB_0020a9b3;
    }
    local_d0._8_8_ = (pointer)0x0;
    local_d0._16_8_ = local_d0._16_8_ & 0xffffffffffffff00;
    local_d0._0_8_ = pcVar2;
    TVar6 = cmGeneratorTarget::GetType(this_00);
    if ((-1 < (int)TVar6) && (TVar6 = cmGeneratorTarget::GetType(this_00), (int)TVar6 < 4)) {
      cmGeneratorTarget::GetLocation(this_00,config);
      std::__cxx11::string::_M_assign((string *)local_d0);
      cmsys::SystemTools::GetFilenamePath(&local_80,(string *)local_d0);
      std::__cxx11::string::operator=((string *)local_d0,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
      cmsys::SystemTools::CollapseFullPath(&local_80,(string *)local_d0);
      std::__cxx11::string::operator=((string *)local_d0,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
    }
    paVar1 = &local_a0.field_2;
    pcVar2 = (inName->_M_dataplus)._M_p;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar2,pcVar2 + inName->_M_string_length);
    cmsys::SystemTools::GetFilenamePath(&local_80,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::CollapseFullPath(&local_a0,&local_80);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    _Var3._M_p = local_80._M_dataplus._M_p;
    if ((local_80._M_string_length == local_d0._8_8_) &&
       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_80._M_string_length ==
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0 ||
        (iVar5 = bcmp(local_80._M_dataplus._M_p,(void *)local_d0._0_8_,local_80._M_string_length),
        iVar5 == 0)))) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != &local_80.field_2) {
        operator_delete(_Var3._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
      goto LAB_0020a7bf;
    }
    std::__cxx11::string::_M_assign((string *)dep);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  bVar4 = true;
LAB_0020a9d3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmLocalGenerator::GetRealDependency(const std::string& inName,
                                         const std::string& config,
                                         std::string& dep)
{
  // Older CMake code may specify the dependency using the target
  // output file rather than the target name.  Such code would have
  // been written before there was support for target properties that
  // modify the name so stripping down to just the file name should
  // produce the target name in this case.
  std::string name = cmSystemTools::GetFilenameName(inName);

  // If the input name is the empty string, there is no real
  // dependency. Short-circuit the other checks:
  if (name.empty()) {
    return false;
  }
  if (cmSystemTools::GetFilenameLastExtension(name) == ".exe") {
    name = cmSystemTools::GetFilenameWithoutLastExtension(name);
  }

  // Look for a CMake target with the given name.
  if (cmGeneratorTarget* target = this->FindGeneratorTargetToUse(name)) {
    // make sure it is not just a coincidence that the target name
    // found is part of the inName
    if (cmSystemTools::FileIsFullPath(inName)) {
      std::string tLocation;
      if (target->GetType() >= cmStateEnums::EXECUTABLE &&
          target->GetType() <= cmStateEnums::MODULE_LIBRARY) {
        tLocation = target->GetLocation(config);
        tLocation = cmSystemTools::GetFilenamePath(tLocation);
        tLocation = cmSystemTools::CollapseFullPath(tLocation);
      }
      std::string depLocation =
        cmSystemTools::GetFilenamePath(std::string(inName));
      depLocation = cmSystemTools::CollapseFullPath(depLocation);
      if (depLocation != tLocation) {
        // it is a full path to a depend that has the same name
        // as a target but is in a different location so do not use
        // the target as the depend
        dep = inName;
        return true;
      }
    }
    switch (target->GetType()) {
      case cmStateEnums::EXECUTABLE:
      case cmStateEnums::STATIC_LIBRARY:
      case cmStateEnums::SHARED_LIBRARY:
      case cmStateEnums::MODULE_LIBRARY:
      case cmStateEnums::UNKNOWN_LIBRARY:
        dep = target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact,
                                  /*realname=*/true);
        return true;
      case cmStateEnums::OBJECT_LIBRARY:
        // An object library has no single file on which to depend.
        // This was listed to get the target-level dependency.
      case cmStateEnums::INTERFACE_LIBRARY:
        // An interface library has no file on which to depend.
        // This was listed to get the target-level dependency.
      case cmStateEnums::UTILITY:
      case cmStateEnums::GLOBAL_TARGET:
        // A utility target has no file on which to depend.  This was listed
        // only to get the target-level dependency.
        return false;
    }
  }

  // The name was not that of a CMake target.  It must name a file.
  if (cmSystemTools::FileIsFullPath(inName)) {
    // This is a full path.  Return it as given.
    dep = inName;
    return true;
  }

  // Check for a source file in this directory that matches the
  // dependency.
  if (cmSourceFile* sf = this->Makefile->GetSource(inName)) {
    dep = sf->ResolveFullPath();
    return true;
  }

  // Treat the name as relative to the source directory in which it
  // was given.
  dep = cmStrCat(this->GetCurrentSourceDirectory(), '/', inName);

  // If the in-source path does not exist, assume it instead lives in the
  // binary directory.
  if (!cmSystemTools::FileExists(dep)) {
    dep = cmStrCat(this->GetCurrentBinaryDirectory(), '/', inName);
  }

  dep = cmSystemTools::CollapseFullPath(dep, this->GetBinaryDirectory());

  return true;
}